

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O0

dictionary_t dictionary_datrie_open(char *filename)

{
  int iVar1;
  FILE *__stream;
  FILE *fp;
  datrie_dictionary_desc *datrie_dictionary;
  char *filename_local;
  
  filename_local = (char *)malloc(0x40);
  ((datrie_dictionary_desc *)filename_local)->dat = (DoubleArrayTrieItem *)0x0;
  ((datrie_dictionary_desc *)filename_local)->lexicon = (ucs4_t *)0x0;
  __stream = fopen(filename,"rb");
  iVar1 = load_dict((datrie_dictionary_desc *)filename_local,(FILE *)__stream);
  if (iVar1 == -1) {
    dictionary_datrie_close(filename_local);
    filename_local = (char *)0xffffffffffffffff;
  }
  else {
    fclose(__stream);
  }
  return filename_local;
}

Assistant:

dictionary_t dictionary_datrie_open(const char * filename)
{
	datrie_dictionary_desc * datrie_dictionary = (datrie_dictionary_desc *) malloc(sizeof(datrie_dictionary_desc));
	datrie_dictionary->dat = NULL;
	datrie_dictionary->lexicon = NULL;

	FILE * fp = fopen(filename, "rb");

	if (load_dict(datrie_dictionary, fp) == -1)
	{
		dictionary_datrie_close((dictionary_t) datrie_dictionary);
		return (dictionary_t) -1;
	}

	fclose(fp);

	return (dictionary_t) datrie_dictionary;
}